

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

double * __thiscall Graph::getTotalLoss(Graph *this)

{
  pointer pLVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = 0x10;
  pdVar2 = (double *)operator_new__(0x10);
  *pdVar2 = 0.0;
  pdVar2[1] = 0.0;
  if ((this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
      super__Vector_impl_data._M_start) {
    dVar6 = 0.0;
    uVar5 = 0;
    dVar8 = 0.0;
    do {
      dVar7 = evaluateLossesAndFlows(this,1e-12,(int)uVar5);
      dVar8 = dVar8 + dVar7 * 100000.0;
      *pdVar2 = dVar8;
      pLVar1 = (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = dVar6 + (double)*(int *)((long)pLVar1 + lVar4 + -8) * dVar7 * 100000.0 *
                      *(double *)((long)&pLVar1->level + lVar4);
      pdVar2[1] = dVar6;
      uVar5 = uVar5 + 1;
      uVar3 = ((long)(this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pLVar1 >> 3) * -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  return pdVar2;
}

Assistant:

double * Graph::getTotalLoss(){
    double * total_loss = new double[2];
    total_loss[0] = 0.0;
    total_loss[1] = 0.0;
    for(int i = 0; i < this->loads.size() ; i++) {
        double lvl_loss = 100 * 1000 * this->evaluateLossesAndFlows(1e-12, i);
        total_loss[0] += lvl_loss;
        total_loss[1] += lvl_loss * this->loads[i].time * this->loads[i].cost;
    }
    return total_loss;
}